

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

int j2k_calculate_tp(opj_cp_t *cp,int img_numcomp,opj_image_t *image,opj_j2k_t *j2k)

{
  uint uVar1;
  opj_tcp_t *poVar2;
  opj_tile_info_t *poVar3;
  int iVar4;
  int *piVar5;
  opj_pi_iterator_t *pi;
  opj_tp_info_t *poVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int pino;
  uint uVar10;
  int local_4c;
  
  piVar5 = (int *)malloc((long)cp->th * (long)cp->tw * 4);
  j2k->cur_totnum_tp = piVar5;
  if (cp->th * cp->tw < 1) {
    local_4c = 0;
  }
  else {
    lVar9 = 0;
    local_4c = 0;
    do {
      poVar2 = cp->tcps;
      uVar1 = poVar2[lVar9].numpocs;
      uVar10 = uVar1 >> 0x1f;
      if ((int)uVar1 < 0) {
        iVar7 = 0;
      }
      else {
        iVar7 = 0;
        pino = -1;
        do {
          pino = pino + 1;
          iVar8 = (int)lVar9;
          pi = pi_initialise_encode(image,cp,iVar8,FINAL_PASS);
          if (pi == (opj_pi_iterator_t *)0x0) goto LAB_00123a3d;
          iVar4 = j2k_get_num_tp(cp,pino,iVar8);
          local_4c = local_4c + iVar4;
          iVar7 = iVar7 + iVar4;
          pi_destroy(pi,cp,iVar8);
          iVar8 = poVar2[lVar9].numpocs;
          uVar10 = (uint)(iVar8 <= pino);
        } while (pino < iVar8);
      }
      j2k->cur_totnum_tp[lVar9] = iVar7;
      if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
        poVar3 = j2k->cstr_info->tile;
        poVar3[lVar9].num_tps = iVar7;
        poVar6 = (opj_tp_info_t *)malloc((long)iVar7 * 0x14);
        poVar3[lVar9].tp = poVar6;
      }
LAB_00123a3d:
      if (uVar10 == 0) {
        return -1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (long)cp->th * (long)cp->tw);
  }
  return local_4c;
}

Assistant:

int j2k_calculate_tp(opj_cp_t *cp,int img_numcomp,opj_image_t *image,opj_j2k_t *j2k ){
	int pino,tileno,totnum_tp=0;

	OPJ_ARG_NOT_USED(img_numcomp);

	j2k->cur_totnum_tp = (int *) opj_malloc(cp->tw * cp->th * sizeof(int));
	for (tileno = 0; tileno < cp->tw * cp->th; tileno++) {
		int cur_totnum_tp = 0;
		opj_tcp_t *tcp = &cp->tcps[tileno];
		for(pino = 0; pino <= tcp->numpocs; pino++) {
			int tp_num=0;
			opj_pi_iterator_t *pi = pi_initialise_encode(image, cp, tileno,FINAL_PASS);
			if(!pi) { return -1;}
			tp_num = j2k_get_num_tp(cp,pino,tileno);
			totnum_tp = totnum_tp + tp_num;
			cur_totnum_tp = cur_totnum_tp + tp_num;
			pi_destroy(pi, cp, tileno);
		}
		j2k->cur_totnum_tp[tileno] = cur_totnum_tp;
		/* INDEX >> */
		if (j2k->cstr_info) {
			j2k->cstr_info->tile[tileno].num_tps = cur_totnum_tp;
			j2k->cstr_info->tile[tileno].tp = (opj_tp_info_t *) opj_malloc(cur_totnum_tp * sizeof(opj_tp_info_t));
		}
		/* << INDEX */
	}
	return totnum_tp;
}